

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O0

DdNode * Extra_zddRandomSet(DdManager *dd,int n,int k,double d)

{
  int *VarValues_00;
  time_t seed;
  long lVar1;
  DdNode *n_00;
  DdNode *pDVar2;
  int *VarValues;
  int local_48;
  int Limit;
  int v;
  int c;
  DdNode *Aux;
  DdNode *TempComb;
  DdNode *Result;
  double d_local;
  int k_local;
  int n_local;
  DdManager *dd_local;
  
  if ((((n < 1) || (k < 1)) || (d < 0.0)) || (1.0 < d)) {
    dd_local = (DdManager *)0x0;
  }
  else {
    VarValues_00 = (int *)malloc((long)n << 2);
    if (VarValues_00 == (int *)0x0) {
      dd->errorCode = CUDD_MEMORY_OUT;
      dd_local = (DdManager *)0x0;
    }
    else {
      TempComb = dd->zero;
      Cudd_Ref(TempComb);
      seed = time((time_t *)0x0);
      Cudd_Srandom(seed);
      for (Limit = 0; Limit < k; Limit = Limit + 1) {
        for (local_48 = 0; local_48 < n; local_48 = local_48 + 1) {
          lVar1 = Cudd_Random();
          if ((int)(d * 2147483561.0) < lVar1) {
            VarValues_00[local_48] = 0;
          }
          else {
            VarValues_00[local_48] = 1;
          }
        }
        n_00 = Extra_zddCombination(dd,VarValues_00,n);
        Cudd_Ref(n_00);
        if (Limit == 0) {
LAB_00a8ceb2:
          pDVar2 = Cudd_zddUnion(dd,TempComb,n_00);
          Cudd_Ref(pDVar2);
          Cudd_RecursiveDerefZdd(dd,TempComb);
          Cudd_RecursiveDerefZdd(dd,n_00);
          TempComb = pDVar2;
        }
        else {
          pDVar2 = Cudd_zddDiff(dd,TempComb,n_00);
          Cudd_Ref(pDVar2);
          if (pDVar2 == TempComb) {
            Cudd_Deref(pDVar2);
            goto LAB_00a8ceb2;
          }
          Cudd_RecursiveDerefZdd(dd,pDVar2);
          Cudd_RecursiveDerefZdd(dd,n_00);
          Limit = Limit + -1;
        }
      }
      if (VarValues_00 != (int *)0x0) {
        free(VarValues_00);
      }
      Cudd_Deref(TempComb);
      dd_local = (DdManager *)TempComb;
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode* Extra_zddRandomSet( 
  DdManager * dd,   /* the DD manager */
  int n,            /* the number of elements */
  int k,            /* the number of combinations (subsets) */
  double d)         /* average density of elements in combinations */
{
    DdNode *Result, *TempComb, *Aux;
    int c, v, Limit, *VarValues;

    /* sanity check the parameters */
    if ( n <= 0 || k <= 0 || d < 0.0 || d > 1.0 )
        return NULL;

    /* allocate temporary storage for variable values */
    VarValues = ABC_ALLOC( int, n );
    if (VarValues == NULL) 
    {
        dd->errorCode = CUDD_MEMORY_OUT;
        return NULL;
    }

    /* start the new set */
    Result = dd->zero;
    Cudd_Ref( Result );

    /* seed random number generator */
    Cudd_Srandom( time(NULL) );
//  Cudd_Srandom( 4 );
    /* determine the limit below which var belongs to the combination */
    Limit = (int)(d * 2147483561.0);

    /* add combinations one by one */
    for ( c = 0; c < k; c++ )
    {
        for ( v = 0; v < n; v++ )
            if ( Cudd_Random() <= Limit )
                VarValues[v] = 1;
            else
                VarValues[v] = 0;

        TempComb = Extra_zddCombination( dd, VarValues, n );
        Cudd_Ref( TempComb );

        /* make sure that this combination is not already in the set */
        if ( c )
        { /* at least one combination is already included */

            Aux = Cudd_zddDiff( dd, Result, TempComb );
            Cudd_Ref( Aux );
            if ( Aux != Result )
            {
                Cudd_RecursiveDerefZdd( dd, Aux );
                Cudd_RecursiveDerefZdd( dd, TempComb );
                c--;
                continue;
            }
            else 
            { /* Aux is the same node as Result */
                Cudd_Deref( Aux );
            }
        }

        Result = Cudd_zddUnion( dd, Aux = Result, TempComb );
        Cudd_Ref( Result );
        Cudd_RecursiveDerefZdd( dd, Aux );
        Cudd_RecursiveDerefZdd( dd, TempComb );
    }

    ABC_FREE( VarValues );
    Cudd_Deref( Result );
    return Result;

}